

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreSieve.cpp
# Opt level: O1

void primesieve::PreSieve::preSieve
               (Vector<unsigned_char,_std::allocator<unsigned_char>_> *sieve,uint64_t segmentLow)

{
  uint8_t *preSieved0;
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  byte bVar26;
  ulong uVar27;
  long lVar28;
  uint8_t *preSieved3;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint8_t *preSieved2;
  ulong uVar32;
  ulong uVar33;
  uint8_t *preSieved1;
  long lVar34;
  uchar *puVar35;
  uint8_t *sieve_00;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  Array<unsigned_char,_8UL> primeBits;
  ulong local_80;
  undefined8 local_38;
  
  bVar26 = (anonymous_namespace)::cpu_supports_avx512_bw;
  puVar35 = sieve->array_;
  uVar36 = (long)sieve->end_ - (long)puVar35;
  if (uVar36 != 0) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = segmentLow + ((segmentLow >> 1) / 0x17787) * -0x2ef0e;
    uVar29 = SUB168(auVar9 * ZEXT816(0x888888888888889),8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = segmentLow + ((segmentLow >> 1) / 0x17ba1) * -0x2f742;
    uVar30 = SUB168(auVar10 * ZEXT816(0x888888888888889),8);
    uVar31 = (segmentLow % 0x2ba16) / 0x1e;
    uVar43 = 0;
    uVar44 = (segmentLow % 0x30f2a) / 0x1e;
    do {
      uVar36 = uVar36 - uVar43;
      uVar32 = 0x1745 - uVar31;
      uVar33 = uVar36;
      if (uVar32 < uVar36) {
        uVar33 = uVar32;
      }
      uVar40 = 0x194f - uVar30;
      if (uVar40 < uVar33) {
        uVar33 = uVar40;
      }
      uVar42 = 0x1909 - uVar29;
      if (uVar42 < uVar33) {
        uVar33 = uVar42;
      }
      uVar27 = 0x1a1b - uVar44;
      if (uVar27 < uVar33) {
        uVar33 = uVar27;
      }
      if (bVar26 == 0) {
        uVar38 = 0;
        if ((uVar33 & 0xfffffffffffffff0) != 0) {
          do {
            puVar1 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE_ + uVar31 + uVar38);
            uVar11 = puVar1[1];
            uVar12 = puVar1[2];
            uVar13 = puVar1[3];
            puVar2 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE0_ + uVar30 + uVar38);
            uVar14 = puVar2[1];
            uVar15 = puVar2[2];
            uVar16 = puVar2[3];
            puVar3 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE1_ + uVar29 + uVar38);
            uVar17 = puVar3[1];
            uVar18 = puVar3[2];
            uVar19 = puVar3[3];
            puVar4 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE2_ + uVar44 + uVar38);
            uVar20 = puVar4[1];
            uVar21 = puVar4[2];
            uVar22 = puVar4[3];
            puVar5 = (uint *)(puVar35 + uVar43 + uVar38);
            *puVar5 = *puVar4 & *puVar3 & *puVar2 & *puVar1;
            puVar5[1] = uVar20 & uVar17 & uVar14 & uVar11;
            puVar5[2] = uVar21 & uVar18 & uVar15 & uVar12;
            puVar5[3] = uVar22 & uVar19 & uVar16 & uVar13;
            uVar38 = uVar38 + 0x10;
          } while (uVar38 < (uVar33 & 0xfffffffffffffff0));
        }
        if (uVar38 < uVar33) {
          if (uVar36 < uVar27) {
            uVar27 = uVar36;
          }
          if (uVar40 <= uVar27) {
            uVar27 = uVar40;
          }
          if (uVar42 <= uVar27) {
            uVar27 = uVar42;
          }
          if (uVar32 <= uVar27) {
            uVar27 = uVar32;
          }
          lVar34 = 0;
          do {
            puVar35[lVar34 + uVar43 + uVar38] =
                 _ZGRN12_GLOBAL__N_114preSieveTablesE0_[lVar34 + uVar30 + uVar38] &
                 _ZGRN12_GLOBAL__N_114preSieveTablesE_[lVar34 + uVar38 + uVar31] &
                 _ZGRN12_GLOBAL__N_114preSieveTablesE1_[lVar34 + uVar29 + uVar38] &
                 _ZGRN12_GLOBAL__N_114preSieveTablesE2_[lVar34 + uVar44 + uVar38];
            lVar34 = lVar34 + 1;
          } while (uVar27 - uVar38 != lVar34);
        }
      }
      else {
        anon_unknown.dwarf_1a5911::presieve1_x86_avx512
                  (_ZGRN12_GLOBAL__N_114preSieveTablesE_ + uVar31,
                   _ZGRN12_GLOBAL__N_114preSieveTablesE0_ + uVar30,
                   _ZGRN12_GLOBAL__N_114preSieveTablesE1_ + uVar29,
                   _ZGRN12_GLOBAL__N_114preSieveTablesE2_ + uVar44,puVar35 + uVar43,uVar33);
      }
      uVar43 = uVar43 + uVar33;
      bVar46 = 0x1744 < uVar31;
      uVar31 = uVar33 + uVar31;
      if (bVar46) {
        uVar31 = 0;
      }
      bVar46 = 0x194e < uVar30;
      uVar30 = uVar33 + uVar30;
      if (bVar46) {
        uVar30 = 0;
      }
      bVar46 = 0x1908 < uVar29;
      uVar29 = uVar33 + uVar29;
      if (bVar46) {
        uVar29 = 0;
      }
      uVar33 = uVar33 + uVar44;
      if (0x1a1a < uVar44) {
        uVar33 = 0;
      }
      puVar35 = sieve->array_;
      uVar36 = (long)sieve->end_ - (long)puVar35;
      uVar44 = uVar33;
    } while (uVar43 < uVar36);
  }
  bVar26 = (anonymous_namespace)::cpu_supports_avx512_bw;
  local_80 = 4;
  do {
    puVar35 = sieve->array_;
    uVar36 = (long)sieve->end_ - (long)puVar35;
    if (uVar36 != 0) {
      lVar28 = local_80 * 0x10;
      uVar31 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar28 + 8);
      uVar30 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar28 + 0x18);
      uVar29 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar28 + 0x28);
      uVar44 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar28 + 0x38);
      uVar40 = (segmentLow % (uVar44 * 0x1e)) / 0x1e;
      lVar34 = *(long *)((anonymous_namespace)::preSieveTables + lVar28);
      lVar7 = *(long *)((anonymous_namespace)::preSieveTables + lVar28 + 0x10);
      lVar8 = *(long *)((anonymous_namespace)::preSieveTables + lVar28 + 0x20);
      lVar28 = *(long *)((anonymous_namespace)::preSieveTables + lVar28 + 0x30);
      uVar42 = 0;
      uVar43 = (segmentLow % (uVar29 * 0x1e)) / 0x1e;
      uVar33 = (segmentLow % (uVar31 * 0x1e)) / 0x1e;
      uVar32 = (segmentLow % (uVar30 * 0x1e)) / 0x1e;
      do {
        uVar36 = uVar36 - uVar42;
        uVar27 = uVar31 - uVar33;
        uVar38 = uVar36;
        if (uVar27 < uVar36) {
          uVar38 = uVar27;
        }
        uVar37 = uVar30 - uVar32;
        if (uVar37 < uVar38) {
          uVar38 = uVar37;
        }
        uVar39 = uVar29 - uVar43;
        if (uVar39 < uVar38) {
          uVar38 = uVar39;
        }
        uVar45 = uVar44 - uVar40;
        if (uVar45 < uVar38) {
          uVar38 = uVar45;
        }
        preSieved0 = (uint8_t *)(lVar34 + uVar33);
        preSieved1 = (uint8_t *)(lVar7 + uVar32);
        preSieved2 = (uint8_t *)(lVar8 + uVar43);
        preSieved3 = (uint8_t *)(uVar40 + lVar28);
        sieve_00 = puVar35 + uVar42;
        if ((bVar26 & 1) == 0) {
          uVar41 = 0;
          if ((uVar38 & 0xfffffffffffffff0) != 0) {
            do {
              puVar1 = (uint *)(sieve_00 + uVar41);
              uVar11 = puVar1[1];
              uVar12 = puVar1[2];
              uVar13 = puVar1[3];
              puVar2 = (uint *)(preSieved0 + uVar41);
              uVar14 = puVar2[1];
              uVar15 = puVar2[2];
              uVar16 = puVar2[3];
              puVar3 = (uint *)(preSieved1 + uVar41);
              uVar17 = puVar3[1];
              uVar18 = puVar3[2];
              uVar19 = puVar3[3];
              puVar4 = (uint *)(preSieved2 + uVar41);
              uVar20 = puVar4[1];
              uVar21 = puVar4[2];
              uVar22 = puVar4[3];
              puVar5 = (uint *)(preSieved3 + uVar41);
              uVar23 = puVar5[1];
              uVar24 = puVar5[2];
              uVar25 = puVar5[3];
              puVar6 = (uint *)(sieve_00 + uVar41);
              *puVar6 = *puVar5 & *puVar4 & *puVar3 & *puVar2 & *puVar1;
              puVar6[1] = uVar23 & uVar20 & uVar17 & uVar14 & uVar11;
              puVar6[2] = uVar24 & uVar21 & uVar18 & uVar15 & uVar12;
              puVar6[3] = uVar25 & uVar22 & uVar19 & uVar16 & uVar13;
              uVar41 = uVar41 + 0x10;
            } while (uVar41 < (uVar38 & 0xfffffffffffffff0));
          }
          if (uVar41 < uVar38) {
            if (uVar36 < uVar27) {
              uVar27 = uVar36;
            }
            if (uVar37 <= uVar27) {
              uVar27 = uVar37;
            }
            if (uVar39 <= uVar27) {
              uVar27 = uVar39;
            }
            if (uVar45 <= uVar27) {
              uVar27 = uVar45;
            }
            do {
              sieve_00[uVar41] =
                   sieve_00[uVar41] &
                   preSieved1[uVar41] & preSieved0[uVar41] & preSieved2[uVar41] & preSieved3[uVar41]
              ;
              uVar41 = uVar41 + 1;
            } while (uVar27 != uVar41);
          }
        }
        else {
          anon_unknown.dwarf_1a5911::presieve2_x86_avx512
                    (preSieved0,preSieved1,preSieved2,preSieved3,sieve_00,uVar38);
        }
        uVar42 = uVar42 + uVar38;
        uVar27 = uVar38 + uVar33;
        if (uVar31 <= uVar33) {
          uVar27 = 0;
        }
        uVar37 = uVar38 + uVar32;
        if (uVar30 <= uVar32) {
          uVar37 = 0;
        }
        uVar33 = uVar38 + uVar43;
        if (uVar29 <= uVar43) {
          uVar33 = 0;
        }
        bVar46 = uVar44 <= uVar40;
        uVar40 = uVar38 + uVar40;
        if (bVar46) {
          uVar40 = 0;
        }
        puVar35 = sieve->array_;
        uVar36 = (long)sieve->end_ - (long)puVar35;
        uVar43 = uVar33;
        uVar33 = uVar27;
        uVar32 = uVar37;
      } while (uVar42 < uVar36);
    }
    bVar46 = local_80 < 0xc;
    local_80 = local_80 + 4;
  } while (bVar46);
  if (segmentLow < 0xa4) {
    local_38 = 0xfc9eeddb3f77efff;
    memcpy(sieve->array_,(void *)((long)&local_38 + segmentLow / 0x1e),8 - segmentLow / 0x1e);
  }
  return;
}

Assistant:

void PreSieve::preSieve(Vector<uint8_t>& sieve, uint64_t segmentLow)
{
  uint64_t offset = 0;
  uint64_t pos0, pos1, pos2, pos3;

  pos0 = (segmentLow % (preSieveTables[0].size() * 30)) / 30;
  pos1 = (segmentLow % (preSieveTables[1].size() * 30)) / 30;
  pos2 = (segmentLow % (preSieveTables[2].size() * 30)) / 30;
  pos3 = (segmentLow % (preSieveTables[3].size() * 30)) / 30;

  // PreSieve algo 1
  while (offset < sieve.size())
  {
    uint64_t bytesToCopy = sieve.size() - offset;

    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[0].size() - pos0));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[1].size() - pos1));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[2].size() - pos2));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[3].size() - pos3));

    presieve1(&*(preSieveTables[0].begin() + pos0),
              &*(preSieveTables[1].begin() + pos1),
              &*(preSieveTables[2].begin() + pos2),
              &*(preSieveTables[3].begin() + pos3),
              &sieve[offset],
              bytesToCopy);

    offset += bytesToCopy;

    pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[0].size());
    pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[1].size());
    pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[2].size());
    pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[3].size());
  }

  // PreSieve algo 2
  for (std::size_t i = 4; i < preSieveTables.size(); i += 4)
  {
    offset = 0;

    pos0 = (segmentLow % (preSieveTables[i+0].size() * 30)) / 30;
    pos1 = (segmentLow % (preSieveTables[i+1].size() * 30)) / 30;
    pos2 = (segmentLow % (preSieveTables[i+2].size() * 30)) / 30;
    pos3 = (segmentLow % (preSieveTables[i+3].size() * 30)) / 30;

    while (offset < sieve.size())
    {
      uint64_t bytesToCopy = sieve.size() - offset;

      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+0].size() - pos0));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+1].size() - pos1));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+2].size() - pos2));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+3].size() - pos3));

      presieve2(&*(preSieveTables[i+0].begin() + pos0),
                &*(preSieveTables[i+1].begin() + pos1),
                &*(preSieveTables[i+2].begin() + pos2),
                &*(preSieveTables[i+3].begin() + pos3),
                &sieve[offset],
                bytesToCopy);

      offset += bytesToCopy;

      pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[i+0].size());
      pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[i+1].size());
      pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[i+2].size());
      pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[i+3].size());
    }
  }

  // Pre-sieving removes the primes <= 163. We
  // have to undo that work and reset these bits
  // to 1 (but 49 = 7 * 7 is not a prime).
  if (segmentLow <= getMaxPrime())
  {
    uint64_t i = segmentLow / 30;
    uint8_t* sieveArray = sieve.data();
    Array<uint8_t, 8> primeBits = { 0xff, 0xef, 0x77, 0x3f, 0xdb, 0xed, 0x9e, 0xfc };

    ASSERT(sieve.capacity() >= primeBits.size());
    for (std::size_t j = 0; i + j < primeBits.size(); j++)
      sieveArray[j] = primeBits[i + j];
  }
}